

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O1

bool CheckConvertToUnixSlashes(string *input,string *output)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  string result;
  string local_40;
  
  pcVar1 = (input->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + input->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_40);
  bVar4 = true;
  if (local_40._M_string_length == output->_M_string_length) {
    if (local_40._M_string_length == 0) {
      bVar4 = false;
    }
    else {
      iVar2 = bcmp(local_40._M_dataplus._M_p,(output->_M_dataplus)._M_p,local_40._M_string_length);
      bVar4 = iVar2 != 0;
    }
  }
  if (bVar4 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToUnixSlashes - input: ",0x2b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(input->_M_dataplus)._M_p,input->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," output: ",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(output->_M_dataplus)._M_p,output->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

static bool CheckConvertToUnixSlashes(std::string const& input,
                                      std::string const& output)
{
  std::string result = input;
  kwsys::SystemTools::ConvertToUnixSlashes(result);
  if (result != output) {
    std::cerr << "Problem with ConvertToUnixSlashes - input: " << input
              << " output: " << result << " expected: " << output << std::endl;
    return false;
  }
  return true;
}